

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O2

ExprBase *
CreateExtract(ExpressionEvalContext *ctx,ExprMemoryLiteral *memory,uint offset,TypeBase *type)

{
  SynBase *source;
  TypeRef *type_00;
  ExprBase *pEVar1;
  uchar *ptr;
  ExprPointerLiteral addr;
  ExprPointerLiteral EStack_68;
  
  if (memory->ptr->ptr + type->size <= memory->ptr->end) {
    source = (memory->super_ExprBase).source;
    type_00 = ExpressionContext::GetReferenceType(ctx->ctx,type);
    ptr = memory->ptr->ptr + offset;
    ExprPointerLiteral::ExprPointerLiteral
              (&EStack_68,source,&type_00->super_TypeBase,ptr,ptr + type->size);
    pEVar1 = CreateLoad(ctx,&EStack_68.super_ExprBase);
    return pEVar1;
  }
  __assert_fail("memory->ptr->ptr + type->size <= memory->ptr->end",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                ,0x1a9,
                "ExprBase *CreateExtract(ExpressionEvalContext &, ExprMemoryLiteral *, unsigned int, TypeBase *)"
               );
}

Assistant:

ExprBase* CreateExtract(ExpressionEvalContext &ctx, ExprMemoryLiteral *memory, unsigned offset, TypeBase *type)
{
	assert(memory->ptr->ptr + type->size <= memory->ptr->end);

	ExprPointerLiteral addr(memory->source, ctx.ctx.GetReferenceType(type), memory->ptr->ptr + offset, memory->ptr->ptr + offset + type->size);

	return CreateLoad(ctx, &addr);
}